

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O0

float __thiscall
deqp::gles3::Functional::FloatScalar::getValue
          (FloatScalar *this,Functions *gl,ShaderType shaderType)

{
  uint uVar1;
  float fVar2;
  ShaderType shaderType_local;
  Functions *gl_local;
  FloatScalar *this_local;
  
  if ((this->m_isConstant & 1U) == 0) {
    switch((this->m_value).symbol) {
    case SYMBOL_LOWP_UINT_MAX:
      this_local._4_4_ = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_LOWP);
      break;
    case SYMBOL_MEDIUMP_UINT_MAX:
      this_local._4_4_ = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_MEDIUMP);
      break;
    case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:
      fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_LOWP);
      this_local._4_4_ = 1.0 / fVar2;
      break;
    case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:
      fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_MEDIUMP);
      this_local._4_4_ = 1.0 / fVar2;
      break;
    case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:
      uVar1 = std::numeric_limits<unsigned_int>::max();
      fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_LOWP);
      this_local._4_4_ = 1.0 - (float)uVar1 / fVar2;
      break;
    case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:
      uVar1 = std::numeric_limits<unsigned_int>::max();
      fVar2 = getGLSLUintMaxAsFloat(gl,shaderType,PRECISION_MEDIUMP);
      this_local._4_4_ = 1.0 - (float)uVar1 / fVar2;
      break;
    default:
      this_local._4_4_ = 0.0;
    }
  }
  else {
    this_local._4_4_ = (this->m_value).constant;
  }
  return this_local._4_4_;
}

Assistant:

float getValue (const glw::Functions& gl, ShaderType shaderType) const
	{
		if (m_isConstant)
			return m_value.constant;
		else
		{
			switch (m_value.symbol)
			{
				case SYMBOL_LOWP_UINT_MAX:								return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX:							return getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_LOWP_UINT_MAX_RECIPROCAL:					return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_MEDIUMP_UINT_MAX_RECIPROCAL:				return 1.0f / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_LOWP_UINT_MAX:		return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_LOWP);
				case SYMBOL_ONE_MINUS_UINT32MAX_DIV_MEDIUMP_UINT_MAX:	return 1.0f - (float)std::numeric_limits<deUint32>::max() / getGLSLUintMaxAsFloat(gl, shaderType, PRECISION_MEDIUMP);

				default:
					DE_ASSERT(false);
					return 0.0f;
			}
		}
	}